

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_hoa.cpp
# Opt level: O2

void __thiscall
ear::GainCalculatorHOAImpl::GainCalculatorHOAImpl(GainCalculatorHOAImpl *this,Layout *layout)

{
  bool *__ptr;
  type tVar1;
  double *pdVar2;
  size_type sVar3;
  Index IVar4;
  Index IVar5;
  reference_type pMVar6;
  long i;
  shared_ptr<ear::PointSourcePanner> panner;
  Index n_speakers;
  DenseStorage<double,__1,__1,_3,_0> local_150;
  Matrix<double,__1,__1,_0,__1,__1> local_140;
  __shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2> local_128;
  __shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2> local_118;
  optional_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_108 [2];
  Layout local_d8;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  size_type local_58;
  Index local_50;
  optional_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_48;
  
  (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  (this->is_lfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (bool *)0x0;
  (this->is_lfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->points).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.m_data =
       (double *)0x0;
  (this->points).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.m_rows = 0
  ;
  (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  Layout::withoutLfe(&local_d8,layout);
  configurePolarPanner((ear *)&local_118,&local_d8);
  Layout::~Layout(&local_d8);
  Layout::isLfe((vector<bool,_std::allocator<bool>_> *)&local_d8,layout);
  copy_vector<Eigen::Array<bool,__1,_1,_0,__1,_1>,_std::vector<bool,_std::allocator<bool>_>,_0>
            ((ear *)local_108,(vector<bool,_std::allocator<bool>_> *)&local_d8);
  __ptr = (this->is_lfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.
          m_data;
  (this->is_lfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (bool *)local_108[0]._0_8_;
  tVar1 = (type)(this->is_lfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage
                .m_rows;
  (this->is_lfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       local_108[0].m_storage.dummy_.aligner_;
  local_108[0]._0_8_ = __ptr;
  local_108[0].m_storage.dummy_._0_8_ = tVar1;
  free(__ptr);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)&local_d8);
  hoa::load_points();
  pdVar2 = (this->points).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
           m_data;
  (this->points).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.m_data =
       (double *)local_d8._name._M_dataplus._M_p;
  sVar3 = (this->points).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
          m_rows;
  (this->points).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.m_rows =
       local_d8._name._M_string_length;
  local_d8._name._M_dataplus._M_p = (pointer)pdVar2;
  local_d8._name._M_string_length = sVar3;
  free(pdVar2);
  Eigen::DenseStorage<double,_-1,_-1,_3,_0>::DenseStorage
            (&local_150,(DenseStorage<double,__1,__1,_3,_0> *)this);
  std::__shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_128,&local_118);
  local_d8._name._M_dataplus._M_p = (pointer)0x0;
  local_d8._name._M_string_length = 0x3ff0000000000000;
  local_d8._name.field_2._M_allocated_capacity = 0;
  (**(local_128._M_ptr)->_vptr_PointSourcePanner)(local_108);
  pMVar6 = boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::get
                     ((optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_108);
  IVar4 = (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  boost::optional_detail::optional_base<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~optional_base
            (local_108);
  local_d8._name._M_dataplus._M_p = (pointer)local_150.m_rows;
  local_50 = IVar4;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_140,&local_50,(long *)&local_d8);
  for (i = 0; i < local_150.m_rows; i = i + 1) {
    Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false> *)local_108,
               (Matrix<double,__1,_3,_0,__1,_3> *)&local_150,i);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,1,3,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_68,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false>_> *)
               local_108);
    local_d8._name._M_dataplus._M_p._4_4_ = uStack_64;
    local_d8._name._M_dataplus._M_p._0_4_ = local_68;
    local_d8._name._M_string_length = CONCAT44(uStack_5c,uStack_60);
    local_d8._name.field_2._M_allocated_capacity = local_58;
    (**(local_128._M_ptr)->_vptr_PointSourcePanner)(&local_48,local_128._M_ptr,&local_d8);
    pMVar6 = boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::get
                       ((optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_48);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_d8,&local_140,
               i);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_d8,pMVar6);
    boost::optional_detail::optional_base<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~optional_base
              (&local_48);
  }
  pdVar2 = (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_data;
  (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       local_140.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
  IVar4 = (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows;
  IVar5 = (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_140.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       local_140.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  local_140.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       pdVar2;
  local_140.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       IVar4;
  local_140.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       IVar5;
  free(pdVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128._M_refcount);
  free(local_150.m_data);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
  return;
}

Assistant:

GainCalculatorHOAImpl::GainCalculatorHOAImpl(const Layout &layout) {
    std::shared_ptr<PointSourcePanner> panner =
        configurePolarPanner(layout.withoutLfe());
    is_lfe = copy_vector<decltype(is_lfe)>(layout.isLfe());
    points = hoa::load_points();
    G_virt = hoa::calc_G_virt(
        points, [panner](Eigen::Vector3d pos) { return panner->handle(pos); });
  }